

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

bool __thiscall
duckdb::ART::Scan(ART *this,IndexScanState *state,idx_t max_count,unsafe_vector<row_t> *row_ids)

{
  vector<duckdb::PhysicalType,_true> *this_00;
  mutex *__mutex;
  char cVar1;
  bool bVar2;
  int iVar3;
  Allocator *allocator;
  reference pvVar4;
  InternalException *this_01;
  Value *value;
  idx_t max_len;
  ARTKey key;
  ARTKey upper_bound;
  ArenaAllocator arena_allocator;
  ARTKey local_a8;
  string local_98;
  ArenaAllocator local_78;
  
  value = (Value *)row_ids;
  allocator = Allocator::Get((this->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&local_78,allocator,0x800);
  this_00 = &(this->super_BoundIndex).types;
  pvVar4 = vector<duckdb::PhysicalType,_true>::operator[](this_00,0);
  local_a8 = ARTKey::CreateKey((ARTKey *)&local_78,(ArenaAllocator *)(ulong)*pvVar4,
                               (char)state + UINT64,value);
  max_len = (ulong)this->prefix_count << 0xd;
  ARTKey::VerifyKeyLength(&local_a8,max_len);
  cVar1 = *(char *)&state[0xc]._vptr_IndexScanState;
  __mutex = &(this->super_BoundIndex).lock;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (cVar1 == '\x01') {
    if (iVar3 != 0) {
      ::std::__throw_system_error(iVar3);
    }
    bVar2 = true;
    switch(*(undefined1 *)&state[0x11]._vptr_IndexScanState) {
    case 0x19:
      bVar2 = SearchEqual(this,&local_a8,max_count,row_ids);
      break;
    default:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Index scan type not implemented","");
      InternalException::InternalException(this_01,&local_98);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case 0x1b:
      bVar2 = false;
    case 0x1d:
      bVar2 = SearchLess(this,&local_a8,bVar2,max_count,row_ids);
      break;
    case 0x1c:
      bVar2 = false;
    case 0x1e:
      bVar2 = SearchGreater(this,&local_a8,bVar2,max_count,row_ids);
    }
  }
  else {
    if (iVar3 != 0) {
      ::std::__throw_system_error(iVar3);
    }
    pvVar4 = vector<duckdb::PhysicalType,_true>::operator[](this_00,0);
    local_98._0_16_ =
         ARTKey::CreateKey((ARTKey *)&local_78,(ArenaAllocator *)(ulong)*pvVar4,(char)state + 0x48,
                           value);
    ARTKey::VerifyKeyLength((ARTKey *)&local_98,max_len);
    bVar2 = SearchCloseRange(this,&local_a8,(ARTKey *)&local_98,
                             *(char *)&state[0x11]._vptr_IndexScanState == '\x1e',
                             *(char *)((long)&state[0x11]._vptr_IndexScanState + 1) == '\x1d',
                             max_count,row_ids);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  ArenaAllocator::~ArenaAllocator(&local_78);
  return bVar2;
}

Assistant:

bool ART::Scan(IndexScanState &state, const idx_t max_count, unsafe_vector<row_t> &row_ids) {
	auto &scan_state = state.Cast<ARTIndexScanState>();
	D_ASSERT(scan_state.values[0].type().InternalType() == types[0]);
	ArenaAllocator arena_allocator(Allocator::Get(db));
	auto key = ARTKey::CreateKey(arena_allocator, types[0], scan_state.values[0]);
	auto max_len = MAX_KEY_LEN * prefix_count;
	key.VerifyKeyLength(max_len);

	if (scan_state.values[1].IsNull()) {
		// Single predicate.
		lock_guard<mutex> l(lock);
		switch (scan_state.expressions[0]) {
		case ExpressionType::COMPARE_EQUAL:
			return SearchEqual(key, max_count, row_ids);
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
			return SearchGreater(key, true, max_count, row_ids);
		case ExpressionType::COMPARE_GREATERTHAN:
			return SearchGreater(key, false, max_count, row_ids);
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
			return SearchLess(key, true, max_count, row_ids);
		case ExpressionType::COMPARE_LESSTHAN:
			return SearchLess(key, false, max_count, row_ids);
		default:
			throw InternalException("Index scan type not implemented");
		}
	}

	// Two predicates.
	lock_guard<mutex> l(lock);
	D_ASSERT(scan_state.values[1].type().InternalType() == types[0]);
	auto upper_bound = ARTKey::CreateKey(arena_allocator, types[0], scan_state.values[1]);
	upper_bound.VerifyKeyLength(max_len);

	bool left_equal = scan_state.expressions[0] == ExpressionType ::COMPARE_GREATERTHANOREQUALTO;
	bool right_equal = scan_state.expressions[1] == ExpressionType ::COMPARE_LESSTHANOREQUALTO;
	return SearchCloseRange(key, upper_bound, left_equal, right_equal, max_count, row_ids);
}